

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  cTValue *o1_00;
  cTValue *o2_00;
  undefined4 extraout_var;
  TValue *pTVar5;
  ulong uVar6;
  code *pcVar7;
  GCtab *pGVar8;
  
  pGVar8 = (GCtab *)(ulong)(o1->gch).metatable.gcptr32;
  if ((pGVar8 == (GCtab *)0x0) || ((pGVar8->nomm & 0x10) != 0)) {
LAB_001175ac:
    o1_00 = (cTValue *)0x0;
  }
  else {
    o1_00 = lj_tab_getstr(pGVar8,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x1a8));
    if ((o1_00 == (cTValue *)0x0) || ((o1_00->field_2).it == 0xffffffff)) {
      pGVar8->nomm = pGVar8->nomm | 0x10;
      goto LAB_001175ac;
    }
  }
  if (o1_00 == (cTValue *)0x0) {
    return (TValue *)(long)ne;
  }
  uVar2 = (o2->gch).metatable.gcptr32;
  pGVar8 = (GCtab *)(ulong)uVar2;
  if ((o1->gch).metatable.gcptr32 == uVar2) goto LAB_00117614;
  if ((pGVar8 == (GCtab *)0x0) || ((pGVar8->nomm & 0x10) != 0)) {
LAB_001175ef:
    o2_00 = (cTValue *)0x0;
  }
  else {
    o2_00 = lj_tab_getstr(pGVar8,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x1a8));
    if ((o2_00 == (cTValue *)0x0) || ((o2_00->field_2).it == 0xffffffff)) {
      pGVar8->nomm = pGVar8->nomm | 0x10;
      goto LAB_001175ef;
    }
  }
  if (o2_00 == (cTValue *)0x0) {
LAB_0011760b:
    pTVar5 = (TValue *)(long)ne;
    bVar3 = false;
  }
  else {
    iVar4 = lj_obj_equal(o1_00,o2_00);
    pTVar5 = (TValue *)CONCAT44(extraout_var,iVar4);
    if (iVar4 == 0) goto LAB_0011760b;
    bVar3 = true;
  }
  if (!bVar3) {
    return pTVar5;
  }
LAB_00117614:
  uVar6 = (ulong)L->base[-1].u32.lo;
  if (*(char *)(uVar6 + 6) == '\0') {
    pTVar5 = L->base + *(byte *)((ulong)*(uint *)(uVar6 + 0x10) - 0x39);
  }
  else {
    pTVar5 = L->top;
  }
  pcVar7 = lj_cont_condf;
  if (ne == 0) {
    pcVar7 = lj_cont_condt;
  }
  pTVar5->u64 = (uint64_t)(pcVar7 + -0x10ad20);
  pTVar5[1] = *o1_00;
  bVar1 = (o1->gch).gct;
  pTVar5[2].u32.lo = (uint32_t)o1;
  *(uint *)((long)pTVar5 + 0x14) = ~(uint)bVar1;
  pTVar5[3].u32.lo = (uint32_t)o2;
  *(uint *)((long)pTVar5 + 0x1c) = ~(uint)bVar1;
  return pTVar5 + 2;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top++, ne ? lj_cont_condf : lj_cont_condt);
    if (LJ_FR2) setnilV(top++);
    copyTV(L, top++, mo);
    if (LJ_FR2) setnilV(top++);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top, o1, it);
    setgcV(L, top+1, o2, it);
    return top;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}